

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

void __thiscall
QMetaPropertyBuilderPrivate::QMetaPropertyBuilderPrivate
          (QMetaPropertyBuilderPrivate *this,QByteArray *_name,QByteArray *_type,QMetaType _metaType
          ,int notifierIdx,int _revision)

{
  Data *pDVar1;
  char *type;
  
  pDVar1 = (_name->d).d;
  (this->name).d.d = pDVar1;
  (this->name).d.ptr = (_name->d).ptr;
  (this->name).d.size = (_name->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  type = (_type->d).ptr;
  if (type == (char *)0x0) {
    type = &QByteArray::_empty;
  }
  QMetaObject::normalizedType(&this->type,type);
  (this->metaType).d_ptr = _metaType.d_ptr;
  this->flags = 0x4003;
  this->notifySignal = notifierIdx;
  this->revision = _revision;
  return;
}

Assistant:

QMetaPropertyBuilderPrivate
            (const QByteArray& _name, const QByteArray& _type, QMetaType _metaType, int notifierIdx=-1,
             int _revision = 0)
        : name(_name),
          type(QMetaObject::normalizedType(_type.constData())),
          metaType(_metaType),
          flags(Readable | Writable | Scriptable), notifySignal(notifierIdx),
          revision(_revision)
    {

    }